

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  pointer ppVar6;
  TestError *pTVar7;
  undefined4 uStack_248;
  undefined4 uStack_244;
  GLdouble buffer_data_3 [16];
  GLuint buffer_data_2 [16];
  GLint buffer_data_1 [16];
  GLfloat buffer_data [16];
  undefined4 local_fc;
  GLint my_uniform_block_index;
  GLuint buffer_object_id;
  GLint *local_d8;
  string *vertex_shader_source;
  string **local_b0;
  string *fragment_shader_source;
  undefined1 local_98 [8];
  string uniform_use;
  string uniform_definition;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_50;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_40;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  size_t num_var_types;
  test_var_type *var_types_set;
  Functions *gl;
  TestShaderType tested_shader_type_local;
  InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES> *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
                      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.context_id);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)0x2 < var_iterator._M_node) {
      return;
    }
    local_48._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                test_shader_compilation::var_types_set_es + (long)var_iterator._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_40,&local_48);
    uniform_definition.field_2._8_8_ =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_50,(iterator *)((long)&uniform_definition.field_2 + 8));
    bVar1 = std::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    std::__cxx11::string::string((string *)(uniform_use.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_98);
    std::__cxx11::string::operator+=
              ((string *)(uniform_use.field_2._M_local_buf + 8),
               "layout (std140) uniform uniform_block_name\n{\n");
    std::__cxx11::string::operator+=((string *)(uniform_use.field_2._M_local_buf + 8),"    ");
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_40);
    std::__cxx11::string::operator+=
              ((string *)(uniform_use.field_2._M_local_buf + 8),(string *)&ppVar6->second);
    std::__cxx11::string::operator+=
              ((string *)(uniform_use.field_2._M_local_buf + 8)," my_uniform_1[1][1][1][1];\n};\n");
    std::__cxx11::string::operator=
              ((string *)local_98,"    float result = float(my_uniform_1[0][0][0][0]);\n");
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>::prepare_fragment_shader
              ((string *)&vertex_shader_source,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>,
               tested_shader_type,(string *)((long)&uniform_use.field_2 + 8),(string *)local_98);
    local_b0 = &vertex_shader_source;
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>::prepare_vertex_shader
              ((string *)&my_uniform_block_index,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>,
               tested_shader_type,(string *)((long)&uniform_use.field_2 + 8),(string *)local_98);
    local_d8 = &my_uniform_block_index;
    (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.super_TestCase.super_TestNode.
      _vptr_TestNode[9])(this,local_d8,local_b0,0);
    std::__cxx11::string::~string((string *)&my_uniform_block_index);
    std::__cxx11::string::~string((string *)&vertex_shader_source);
    local_fc = 0;
    (**(code **)(lVar5 + 0x1680))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glUseProgram() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b55);
    iVar2 = (**(code **)(lVar5 + 0xb38))
                      ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
                       super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id,
                       "uniform_block_name");
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetUniformBlockIndex() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,7000);
    if (iVar2 == -1) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Uniform block not found or is considered as not active.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1b5c);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar5 + 0x6c8))(1,&local_fc);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGenBuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b60);
    (**(code **)(lVar5 + 0x40))(0x8a11,local_fc);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b63);
    switch(var_iterator._M_node) {
    case (_Base_ptr)0x0:
      buffer_data_1[0xe] = 0;
      buffer_data_1[0xf] = 0x3f800000;
      (**(code **)(lVar5 + 0x150))(0x8a11,0x40,buffer_data_1 + 0xe,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b6d);
      break;
    case (_Base_ptr)0x1:
      buffer_data_1[10] = 0xc;
      buffer_data_1[0xb] = 0xd;
      buffer_data_1[0xc] = 0xe;
      buffer_data_1[0xd] = 0xf;
      buffer_data_1[6] = 8;
      buffer_data_1[7] = 9;
      buffer_data_1[8] = 10;
      buffer_data_1[9] = 0xb;
      buffer_data_1[2] = 4;
      buffer_data_1[3] = 5;
      buffer_data_1[4] = 6;
      buffer_data_1[5] = 7;
      buffer_data_2[0xe] = 0;
      buffer_data_2[0xf] = 1;
      buffer_data_1[0] = 2;
      buffer_data_1[1] = 3;
      (**(code **)(lVar5 + 0x150))(0x8a11,0x40,buffer_data_2 + 0xe,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b77);
      break;
    case (_Base_ptr)0x2:
      buffer_data_2[10] = 0xc;
      buffer_data_2[0xb] = 0xd;
      buffer_data_2[0xc] = 0xe;
      buffer_data_2[0xd] = 0xf;
      buffer_data_2[6] = 8;
      buffer_data_2[7] = 9;
      buffer_data_2[8] = 10;
      buffer_data_2[9] = 0xb;
      buffer_data_2[2] = 4;
      buffer_data_2[3] = 5;
      buffer_data_2[4] = 6;
      buffer_data_2[5] = 7;
      buffer_data_3[0xf]._0_4_ = 0;
      buffer_data_3[0xf]._4_4_ = 1;
      buffer_data_2[0] = 2;
      buffer_data_2[1] = 3;
      (**(code **)(lVar5 + 0x150))(0x8a11,0x40,buffer_data_3 + 0xf,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b80);
      break;
    case (_Base_ptr)0x3:
      buffer_data_3[0xd] = 14.0;
      buffer_data_3[0xe] = 15.0;
      buffer_data_3[0xb] = 12.0;
      buffer_data_3[0xc] = 13.0;
      buffer_data_3[9] = 10.0;
      buffer_data_3[10] = 11.0;
      buffer_data_3[7] = 8.0;
      buffer_data_3[8] = 9.0;
      buffer_data_3[5] = 6.0;
      buffer_data_3[6] = 7.0;
      buffer_data_3[3] = 4.0;
      buffer_data_3[4] = 5.0;
      buffer_data_3[1] = 2.0;
      buffer_data_3[2] = 3.0;
      uStack_248 = 0;
      uStack_244 = 0;
      buffer_data_3[0]._0_4_ = 0;
      buffer_data_3[0]._4_4_ = 0x3ff00000;
      (**(code **)(lVar5 + 0x150))(0x8a11,0x80,&uStack_248,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b8a);
      break;
    default:
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid variable-type index.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1b90);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar5 + 0x15d0))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id,iVar2,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glUniformBlockBinding() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b97);
    (**(code **)(lVar5 + 0x48))(0x8a11,0,local_fc);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBufferBase() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b9a);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test(this);
    }
    else {
      execute_draw_test(this,tested_shader_type);
    }
    (**(code **)(lVar5 + 0x438))(1,&local_fc);
    (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])();
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)(uniform_use.field_2._M_local_buf + 8));
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1bab);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InteractionUniformBuffers2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const glw::Functions&		gl			  = this->context_id.getRenderContext().getFunctions();
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float / int / uint values. */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string uniform_definition;
			std::string uniform_use;

			uniform_definition += "layout (std140) uniform uniform_block_name\n"
								  "{\n";
			uniform_definition += "    ";
			uniform_definition += var_iterator->second.type;
			uniform_definition += " my_uniform_1[1][1][1][1];\n"
								  "};\n";

			uniform_use = "    float result = float(my_uniform_1[0][0][0][0]);\n";

			if (API::USE_ALL_SHADER_STAGES)
			{
				const std::string& compute_shader_source =
					this->prepare_compute_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& geometry_shader_source =
					this->prepare_geometry_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_ctrl_shader_source =
					this->prepare_tess_ctrl_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_eval_shader_source =
					this->prepare_tess_eval_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				switch (tested_shader_type)
				{
				case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
					break;

				case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
				case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
				case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, tess_ctrl_shader_source, tess_eval_shader_source,
												geometry_shader_source, fragment_shader_source, compute_shader_source,
												false, false);
					break;

				default:
					TCU_FAIL("Invalid enum");
					break;
				}
			}
			else
			{
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
			}

			glw::GLuint buffer_object_id	   = 0;
			glw::GLint  my_uniform_block_index = GL_INVALID_INDEX;

			gl.useProgram(this->program_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

			my_uniform_block_index = gl.getUniformBlockIndex(this->program_object_id, "uniform_block_name");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformBlockIndex() failed.");

			if ((unsigned)my_uniform_block_index == GL_INVALID_INDEX)
			{
				TCU_FAIL("Uniform block not found or is considered as not active.");
			}

			gl.genBuffers(1, &buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed.");

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed.");

			switch (var_type_index)
			{
			case 0: //float type of uniform is considered
			{
				glw::GLfloat buffer_data[] = { 0.0f, 1.0f, 2.0f,  3.0f,  4.0f,  5.0f,  6.0f,  7.0f,
											   8.0f, 9.0f, 10.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* float case */
			case 1: //int type of uniform is considered
			{

				glw::GLint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* int case */
			case 2: //uint type of uniform is considered
			{
				glw::GLuint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* uint case */
			case 3: //double type of uniform is considered
			{
				glw::GLdouble buffer_data[] = { 0.0, 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,
												8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			} /* double case */
			default:
			{
				TCU_FAIL("Invalid variable-type index.");

				break;
			}
			} /* switch (var_type_index) */

			gl.uniformBlockBinding(this->program_object_id, my_uniform_block_index, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformBlockBinding() failed.");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, 0, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed.");

			if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
			{
				execute_draw_test(tested_shader_type);
			}
			else
			{
				execute_dispatch_test();
			}

			/* Deallocate any resources used. */
			gl.deleteBuffers(1, &buffer_object_id);
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}